

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_console.cpp
# Opt level: O0

void Cmd_atexit(FCommandLine *argv,APlayerPawn *who,int key)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  GameAtExit *this;
  FString local_40;
  GameAtExit *local_38;
  GameAtExit *record_1;
  GameAtExit *pGStack_28;
  int i;
  GameAtExit *record;
  APlayerPawn *pAStack_18;
  int key_local;
  APlayerPawn *who_local;
  FCommandLine *argv_local;
  
  record._4_4_ = key;
  pAStack_18 = who;
  who_local = (APlayerPawn *)argv;
  iVar1 = FCommandLine::argc(argv);
  if (iVar1 == 1) {
    Printf("Registered atexit commands:\n");
    for (pGStack_28 = ExitCmdList; pGStack_28 != (GameAtExit *)0x0; pGStack_28 = pGStack_28->Next) {
      pcVar3 = FString::GetChars(&pGStack_28->Command);
      Printf("%s\n",pcVar3);
    }
  }
  else {
    for (record_1._4_4_ = 1; iVar1 = record_1._4_4_,
        iVar2 = FCommandLine::argc((FCommandLine *)who_local), iVar1 < iVar2;
        record_1._4_4_ = record_1._4_4_ + 1) {
      this = (GameAtExit *)operator_new(0x10);
      pcVar3 = FCommandLine::operator[]((FCommandLine *)who_local,record_1._4_4_);
      FString::FString(&local_40,pcVar3);
      GameAtExit::GameAtExit(this,&local_40);
      FString::~FString(&local_40);
      this->Next = ExitCmdList;
      ExitCmdList = this;
      local_38 = this;
    }
  }
  return;
}

Assistant:

CCMD (atexit)
{
	if (argv.argc() == 1)
	{
		Printf ("Registered atexit commands:\n");
		GameAtExit *record = ExitCmdList;
		while (record != NULL)
		{
			Printf ("%s\n", record->Command.GetChars());
			record = record->Next;
		}
		return;
	}
	for (int i = 1; i < argv.argc(); ++i)
	{
		GameAtExit *record = new GameAtExit(argv[i]);
		record->Next = ExitCmdList;
		ExitCmdList = record;
	}
}